

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

uint __thiscall
lzham::symbol_codec::decode(symbol_codec *this,quasi_adaptive_huffman_data_model *model)

{
  unsigned_short uVar1;
  decoder_tables *pdVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *puVar6;
  quasi_adaptive_huffman_data_model *in_RSI;
  long in_RDI;
  uint freq;
  int val_ptr;
  uint32 t;
  uint len;
  uint sym;
  uint k;
  uint c;
  decoder_tables *pTables;
  uint local_30;
  uint local_2c;
  uint local_24;
  
  pdVar2 = in_RSI->m_pDecode_tables;
  while (*(int *)(in_RDI + 0x48) < 0x38) {
    local_24 = 0;
    if (*(long *)(in_RDI + 0x10) == *(long *)(in_RDI + 0x18)) {
      if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
        (**(code **)(in_RDI + 0x30))
                  (*(long *)(in_RDI + 0x10) - *(long *)(in_RDI + 8),*(undefined8 *)(in_RDI + 0x38),
                   in_RDI + 8,in_RDI + 0x20,in_RDI + 0x28);
        *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x20);
        *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 8);
        if (*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) {
          pbVar3 = *(byte **)(in_RDI + 0x10);
          *(byte **)(in_RDI + 0x10) = pbVar3 + 1;
          local_24 = (uint)*pbVar3;
        }
      }
    }
    else {
      pbVar3 = *(byte **)(in_RDI + 0x10);
      *(byte **)(in_RDI + 0x10) = pbVar3 + 1;
      local_24 = (uint)*pbVar3;
    }
    *(int *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) + 8;
    *(ulong *)(in_RDI + 0x40) =
         (ulong)local_24 << (0x40U - (char)*(undefined4 *)(in_RDI + 0x48) & 0x3f) |
         *(ulong *)(in_RDI + 0x40);
  }
  uVar4 = (ushort)((ulong)*(undefined8 *)(in_RDI + 0x40) >> 0x30) + 1;
  if (pdVar2->m_table_max_code < uVar4) {
    local_30 = pdVar2->m_decode_start_code_size;
    while (pdVar2->m_max_codes[local_30 - 1] < uVar4) {
      local_30 = local_30 + 1;
    }
    uVar4 = pdVar2->m_val_ptrs[local_30 - 1] +
            (int)(*(ulong *)(in_RDI + 0x40) >> (0x40U - (char)local_30 & 0x3f));
    if (in_RSI->m_total_syms <= uVar4) {
      return 0;
    }
    local_2c = (uint)pdVar2->m_sorted_symbol_order[(int)uVar4];
  }
  else {
    local_2c = pdVar2->m_lookup
               [*(ulong *)(in_RDI + 0x40) >> (0x40U - (char)pdVar2->m_table_bits & 0x3f)] & 0xffff;
    local_30 = pdVar2->m_lookup
               [*(ulong *)(in_RDI + 0x40) >> (0x40U - (char)pdVar2->m_table_bits & 0x3f)] >> 0x10;
  }
  *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) << ((byte)local_30 & 0x3f);
  *(uint *)(in_RDI + 0x48) = *(int *)(in_RDI + 0x48) - local_30;
  puVar6 = vector<unsigned_short>::operator[](&in_RSI->m_sym_freq,local_2c);
  uVar1 = *puVar6;
  puVar6 = vector<unsigned_short>::operator[](&in_RSI->m_sym_freq,local_2c);
  *puVar6 = uVar1 + 1;
  uVar5 = in_RSI->m_symbols_until_update - 1;
  in_RSI->m_symbols_until_update = uVar5;
  if (uVar5 == 0) {
    *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x4c) + 1;
    quasi_adaptive_huffman_data_model::update_tables(in_RSI,-1,false);
  }
  return local_2c;
}

Assistant:

uint symbol_codec::decode(quasi_adaptive_huffman_data_model& model)
   {
      LZHAM_ASSERT(m_mode == cDecoding);
      LZHAM_ASSERT(!model.m_encoding);

      const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

      while (m_bit_count < (cBitBufSize - 8))
      {
         uint c = 0;
         if (m_pDecode_buf_next == m_pDecode_buf_end)
         {
            if (!m_decode_buf_eof)
            {
               m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
               m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
               m_pDecode_buf_next = m_pDecode_buf;
               if (m_pDecode_buf_next < m_pDecode_buf_end) c = *m_pDecode_buf_next++;
            }
         }
         else
            c = *m_pDecode_buf_next++;

         m_bit_count += 8;
         m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
      }

      uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
      uint sym, len;

      if (k <= pTables->m_table_max_code)
      {
         uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

         LZHAM_ASSERT(t != cUINT32_MAX);
         sym = t & cUINT16_MAX;
         len = t >> 16;

         LZHAM_ASSERT(model.m_code_sizes[sym] == len);
      }
      else
      {
         len = pTables->m_decode_start_code_size;

         for ( ; ; )
         {
            if (k <= pTables->m_max_codes[len - 1])
               break;
            len++;
         }

         int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

         if (((uint)val_ptr >= model.m_total_syms))
         {
            // corrupted stream, or a bug
            LZHAM_ASSERT(0);
            LZHAM_LOG_ERROR(4031);
            return 0;
         }

         sym = pTables->m_sorted_symbol_order[val_ptr];
      }

      m_bit_buf <<= len;
      m_bit_count -= len;

      uint freq = model.m_sym_freq[sym];
      freq++;
      model.m_sym_freq[sym] = static_cast<uint16>(freq);
      
      LZHAM_ASSERT(freq <= cUINT16_MAX);
      
      if (--model.m_symbols_until_update == 0)
      {
         m_total_model_updates++;
         model.update_tables();
      }

      return sym;
   }